

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_sse4.c
# Opt level: O0

void sse8_sse4_1(uint8_t *a,uint8_t *b,__m128i *sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int *in_RDX;
  void *in_RSI;
  void *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __m128i v_d_w;
  __m128i v_b_w;
  __m128i v_a_w;
  __m128i v_b0;
  __m128i v_a0;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  
  xx_loadl_64(in_RDI);
  xx_loadl_64(in_RSI);
  auVar3._8_8_ = extraout_XMM0_Qb;
  auVar3._0_8_ = extraout_XMM0_Qa;
  auVar3 = pmovzxbw(auVar3,extraout_XMM0_Qa);
  auVar4._8_8_ = extraout_XMM0_Qb_00;
  auVar4._0_8_ = extraout_XMM0_Qa_00;
  auVar4 = pmovzxbw(auVar4,extraout_XMM0_Qa_00);
  local_58 = auVar3._0_2_;
  sStack_56 = auVar3._2_2_;
  sStack_54 = auVar3._4_2_;
  sStack_52 = auVar3._6_2_;
  sStack_50 = auVar3._8_2_;
  sStack_4e = auVar3._10_2_;
  sStack_4c = auVar3._12_2_;
  sStack_4a = auVar3._14_2_;
  local_68 = auVar4._0_2_;
  sStack_66 = auVar4._2_2_;
  sStack_64 = auVar4._4_2_;
  sStack_62 = auVar4._6_2_;
  sStack_60 = auVar4._8_2_;
  sStack_5e = auVar4._10_2_;
  sStack_5c = auVar4._12_2_;
  sStack_5a = auVar4._14_2_;
  auVar2._2_2_ = sStack_56 - sStack_66;
  auVar2._0_2_ = local_58 - local_68;
  auVar2._4_2_ = sStack_54 - sStack_64;
  auVar2._6_2_ = sStack_52 - sStack_62;
  auVar2._10_2_ = sStack_4e - sStack_5e;
  auVar2._8_2_ = sStack_50 - sStack_60;
  auVar2._12_2_ = sStack_4c - sStack_5c;
  auVar2._14_2_ = sStack_4a - sStack_5a;
  auVar1._2_2_ = sStack_56 - sStack_66;
  auVar1._0_2_ = local_58 - local_68;
  auVar1._4_2_ = sStack_54 - sStack_64;
  auVar1._6_2_ = sStack_52 - sStack_62;
  auVar1._10_2_ = sStack_4e - sStack_5e;
  auVar1._8_2_ = sStack_50 - sStack_60;
  auVar1._12_2_ = sStack_4c - sStack_5c;
  auVar1._14_2_ = sStack_4a - sStack_5a;
  auVar4 = pmaddwd(auVar2,auVar1);
  local_38 = (int)*(undefined8 *)in_RDX;
  iStack_34 = (int)((ulong)*(undefined8 *)in_RDX >> 0x20);
  iStack_30 = (int)*(undefined8 *)(in_RDX + 2);
  iStack_2c = (int)((ulong)*(undefined8 *)(in_RDX + 2) >> 0x20);
  local_48 = auVar4._0_4_;
  iStack_44 = auVar4._4_4_;
  iStack_40 = auVar4._8_4_;
  iStack_3c = auVar4._12_4_;
  *in_RDX = local_38 + local_48;
  in_RDX[1] = iStack_34 + iStack_44;
  in_RDX[2] = iStack_30 + iStack_40;
  in_RDX[3] = iStack_2c + iStack_3c;
  return;
}

Assistant:

static inline void sse8_sse4_1(const uint8_t *a, const uint8_t *b,
                               __m128i *sum) {
  const __m128i v_a0 = xx_loadl_64(a);
  const __m128i v_b0 = xx_loadl_64(b);
  const __m128i v_a_w = _mm_cvtepu8_epi16(v_a0);
  const __m128i v_b_w = _mm_cvtepu8_epi16(v_b0);
  const __m128i v_d_w = _mm_sub_epi16(v_a_w, v_b_w);
  *sum = _mm_add_epi32(*sum, _mm_madd_epi16(v_d_w, v_d_w));
}